

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict struct_declaration_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  anon_union_16_10_0af5b411_for_u *paVar1;
  short sVar2;
  parse_ctx *ppVar3;
  node_t pnVar4;
  node_t pnVar5;
  node_t pnVar6;
  tpname_t el;
  tpname_t el_00;
  int iVar7;
  node_t_conflict n;
  node *pnVar8;
  node_t_conflict pnVar9;
  node_t_conflict pnVar10;
  node_t_conflict op4;
  anon_union_16_10_0af5b411_for_u *paVar11;
  node_t_conflict pnVar12;
  c2m_ctx_t pcVar13;
  pos_t p;
  pos_t pVar14;
  undefined8 uStack_b8;
  tpname_t tStack_b0;
  anon_union_16_10_0af5b411_for_u *paStack_98;
  node *pnStack_90;
  node_t_conflict pnStack_88;
  c2m_ctx_t pcStack_80;
  node_t pnStack_78;
  node_t_conflict pnStack_70;
  uint local_64;
  char *local_60;
  node *local_58;
  node_t_conflict local_50;
  node_t_conflict local_48;
  parse_ctx *local_40;
  undefined8 local_38;
  
  local_40 = c2m_ctx->parse_ctx;
  pnVar12 = (node_t_conflict)0x54;
  pnStack_70 = (node_t_conflict)0x19a1b2;
  local_64 = no_err_p;
  n = new_node(c2m_ctx,N_LIST);
  do {
    ppVar3 = c2m_ctx->parse_ctx;
    pcVar13 = c2m_ctx;
    if (*(short *)ppVar3->curr_token == 0x117) {
      pnVar12 = (node_t_conflict)(ulong)local_64;
      pnStack_70 = (node_t_conflict)0x19a1da;
      pnVar8 = st_assert(c2m_ctx,local_64);
    }
    else {
      pnStack_70 = (node_t_conflict)0x19a1ea;
      local_48 = spec_qual_list(c2m_ctx,(int)pnVar12);
      pnVar8 = &err_struct;
      if (local_48 != &err_struct) {
        pnStack_70 = (node_t_conflict)0x19a208;
        local_50 = new_node(c2m_ctx,N_LIST);
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
          pnStack_70 = (node_t_conflict)0x19a22a;
          read_token(c2m_ctx);
          pnVar12 = local_48;
          pnStack_70 = (node_t_conflict)0x19a23a;
          pVar14 = get_node_pos(c2m_ctx,local_48);
          local_60 = pVar14._8_8_;
          local_58 = (node *)pVar14.fname;
          pnStack_70 = (node_t_conflict)0x19a251;
          pnVar9 = new_node(c2m_ctx,N_SHARE);
          pnStack_70 = (node_t_conflict)0x19a262;
          op_append(c2m_ctx,pnVar9,pnVar12);
          pnStack_70 = (node_t_conflict)0x19a26c;
          pnVar12 = new_node(c2m_ctx,N_IGNORE);
          pnStack_70 = (node_t_conflict)0x19a279;
          pnVar10 = new_node(c2m_ctx,N_IGNORE);
          pnStack_70 = (node_t_conflict)0x19a286;
          op4 = new_node(c2m_ctx,N_IGNORE);
          pnVar8 = local_50;
          pnStack_70 = (node_t_conflict)0x19a2a4;
          pnVar9 = new_node4(c2m_ctx,N_MEMBER,pnVar9,pnVar12,pnVar10,op4);
          pnStack_70 = (node_t_conflict)0x19a2bc;
          p._8_8_ = local_60;
          p.fname = (char *)local_58;
          add_pos(c2m_ctx,pnVar9,p);
          pnStack_70 = (node_t_conflict)0x19a2ca;
          pnVar12 = pnVar8;
          pcVar13 = c2m_ctx;
          op_append(c2m_ctx,pnVar8,pnVar9);
        }
        else {
          while( true ) {
            pnVar8 = &err_struct;
            if (*(short *)ppVar3->curr_token == 0x3a) {
              pnStack_70 = (node_t_conflict)0x19a2e3;
              pnVar9 = new_node(c2m_ctx,N_IGNORE);
            }
            else {
              pnVar12 = (node_t_conflict)(ulong)local_64;
              pnStack_70 = (node_t_conflict)0x19a2f7;
              pcVar13 = c2m_ctx;
              pnVar9 = declarator(c2m_ctx,local_64);
              if (pnVar9 == &err_struct) goto LAB_0019a456;
              pnStack_70 = (node_t_conflict)0x19a319;
              pnVar8 = try_attr_spec(c2m_ctx,ppVar3->curr_token->pos,(node_t_conflict *)0x0);
            }
            if (pnVar8 == &err_struct) {
              pnStack_70 = (node_t_conflict)0x19a328;
              pnVar8 = new_node(c2m_ctx,N_IGNORE);
            }
            local_58 = pnVar8;
            if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3a) {
              pnStack_70 = (node_t_conflict)0x19a346;
              read_token(c2m_ctx);
              pnVar12 = (node_t_conflict)(ulong)local_64;
              pnStack_70 = (node_t_conflict)0x19a352;
              pcVar13 = c2m_ctx;
              pnVar10 = cond_expr(c2m_ctx,local_64);
              if (pnVar10 == &err_struct) goto LAB_0019a456;
            }
            else {
              pnStack_70 = (node_t_conflict)0x19a369;
              pnVar10 = new_node(c2m_ctx,N_IGNORE);
            }
            pnStack_70 = (node_t_conflict)0x19a37a;
            pVar14 = get_node_pos(c2m_ctx,pnVar9);
            local_38 = pVar14._8_8_;
            local_60 = pVar14.fname;
            pnStack_70 = (node_t_conflict)0x19a391;
            pnVar12 = new_node(c2m_ctx,N_SHARE);
            pnStack_70 = (node_t_conflict)0x19a3a4;
            op_append(c2m_ctx,pnVar12,local_48);
            pnStack_70 = (node_t_conflict)0x19a3bf;
            pnVar9 = new_node4(c2m_ctx,N_MEMBER,pnVar12,pnVar9,local_58,pnVar10);
            pnStack_70 = (node_t_conflict)0x19a3d7;
            pVar14.lno = (undefined4)local_38;
            pVar14.ln_pos = local_38._4_4_;
            pVar14.fname = local_60;
            add_pos(c2m_ctx,pnVar9,pVar14);
            pnVar8 = local_50;
            pnStack_70 = (node_t_conflict)0x19a3ea;
            pnVar12 = local_50;
            pcVar13 = c2m_ctx;
            op_append(c2m_ctx,local_50,pnVar9);
            sVar2 = *(short *)c2m_ctx->parse_ctx->curr_token;
            if (sVar2 != 0x2c) break;
            pnStack_70 = (node_t_conflict)0x19a405;
            read_token(c2m_ctx);
          }
          if (sVar2 == 0x3b) {
            pnStack_70 = (node_t_conflict)0x19a424;
            pcVar13 = c2m_ctx;
            read_token(c2m_ctx);
          }
          else {
            pnVar8 = &err_struct;
            if (ppVar3->record_level == 0) {
              pnStack_70 = (node_t_conflict)0x19a44b;
              pnVar12 = (node_t_conflict)get_token_name(c2m_ctx,0x3b);
              pnStack_70 = (node_t_conflict)0x19a456;
              pcVar13 = c2m_ctx;
              syntax_error(c2m_ctx,(char *)pnVar12);
LAB_0019a456:
              pnVar8 = &err_struct;
            }
          }
        }
      }
    }
    if (pnVar8 == &err_struct) {
      return &err_struct;
    }
    if (pnVar8->code == N_LIST) {
      pnVar9 = (pnVar8->u).ops.head;
      if (pnVar9 != (node_t_conflict)0x0) {
        paVar1 = &pnVar8->u;
        do {
          pnVar4 = (pnVar9->op_link).prev;
          pnVar5 = (pnVar9->op_link).next;
          if (pnVar4 == (node_t)0x0) {
            paVar11 = paVar1;
            if ((node_t_conflict)(paVar1->s).s != pnVar9) goto LAB_0019a508;
          }
          else {
            paVar11 = (anon_union_16_10_0af5b411_for_u *)&(pnVar4->op_link).next;
          }
          (paVar11->ops).head = pnVar5;
          pnVar6 = (pnVar9->op_link).next;
          if (pnVar6 == (node_t)0x0) {
            if ((node_t_conflict)(pnVar8->u).s.len != pnVar9) {
              pnStack_70 = (node_t_conflict)0x19a508;
              struct_declaration_list_cold_2();
LAB_0019a508:
              pnStack_70 = (node_t_conflict)typedef_name;
              struct_declaration_list_cold_1();
              pnStack_90 = &err_struct;
              ppVar3 = pcVar13->parse_ctx;
              paStack_98 = paVar1;
              pnStack_88 = n;
              pcStack_80 = c2m_ctx;
              pnStack_78 = pnVar5;
              pnStack_70 = pnVar8;
              if (*(short *)ppVar3->curr_token != 0x103) {
                if (ppVar3->record_level != 0) {
                  return &err_struct;
                }
                syntax_error(pcVar13,"identifier");
                return &err_struct;
              }
              pnVar8 = ppVar3->curr_token->node;
              read_token(pcVar13);
              pnVar12 = ppVar3->curr_scope;
              el.scope = pnVar12;
              el.id = pnVar8;
              el._16_8_ = uStack_b8;
              iVar7 = HTAB_tpname_t_do(pcVar13->parse_ctx->tpname_tab,el,HTAB_FIND,&tStack_b0);
              if (iVar7 == 0) {
                do {
                  if (pnVar12 == (node_t_conflict)0x0) {
                    return &err_struct;
                  }
                  pnVar12 = (node_t_conflict)pnVar12->attr;
                  el_00.scope = pnVar12;
                  el_00.id = pnVar8;
                  el_00._16_8_ = uStack_b8;
                  iVar7 = HTAB_tpname_t_do(pcVar13->parse_ctx->tpname_tab,el_00,HTAB_FIND,&tStack_b0
                                          );
                } while (iVar7 == 0);
              }
              if (tStack_b0.typedef_p == 0) {
                pnVar8 = &err_struct;
              }
              return pnVar8;
            }
            (pnVar8->u).ops.tail = pnVar4;
          }
          else {
            (pnVar6->op_link).prev = pnVar4;
          }
          (pnVar9->op_link).prev = (node_t)0x0;
          (pnVar9->op_link).next = (node_t)0x0;
          pnStack_70 = (node_t_conflict)0x19a4c3;
          pnVar12 = n;
          pcVar13 = c2m_ctx;
          op_append(c2m_ctx,n,pnVar9);
          pnVar9 = pnVar5;
        } while (pnVar5 != (node_t)0x0);
      }
    }
    else {
      pnStack_70 = (node_t_conflict)0x19a4db;
      pnVar12 = n;
      op_append(c2m_ctx,n,pnVar8);
    }
    if (*(short *)local_40->curr_token == 0x7d) {
      return n;
    }
  } while( true );
}

Assistant:

D (struct_declaration_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t r, res, el, next_el;

  res = new_node (c2m_ctx, N_LIST);
  for (;;) {
    P (struct_declaration);
    if (r->code != N_LIST) {
      op_append (c2m_ctx, res, r);
    } else {
      for (el = NL_HEAD (r->u.ops); el != NULL; el = next_el) {
        next_el = NL_NEXT (el);
        NL_REMOVE (r->u.ops, el);
        op_append (c2m_ctx, res, el);
      }
    }
    if (C ('}')) break;
  }
  return res;
}